

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O1

longlong __thiscall
shift_window_transformer::StageModule<float>::parameterCount(StageModule<float> *this)

{
  longlong lVar1;
  pointer ppSVar2;
  long lVar3;
  ulong uVar4;
  
  lVar1 = Linear<float>::parameterCount(&(this->patch_partition).layer);
  ppSVar2 = (this->layers).
            super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->layers).
      super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    uVar4 = 0;
    do {
      lVar3 = (**(code **)(*(long *)ppSVar2[uVar4] + 8))();
      lVar1 = lVar1 + lVar3;
      uVar4 = uVar4 + 1;
      ppSVar2 = (this->layers).
                super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->layers).
                                   super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3))
    ;
  }
  return lVar1;
}

Assistant:

long long parameterCount() {
            long long ret = patch_partition.parameterCount();
            for (int i = 0; i < layers.size(); ++i) {
                ret += layers[i]->parameterCount();
            }
            return ret;
        }